

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

float __thiscall
duckdb::Interpolator<true>::Extract<float,float>
          (Interpolator<true> *this,float *dest,Vector *result)

{
  float input;
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  float result_1;
  float local_3c;
  string local_38;
  
  input = *dest;
  this_01 = (duckdb *)0x0;
  bVar1 = TryCast::Operation<float,float>(input,&local_3c,false);
  if (bVar1) {
    return local_3c;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,float>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}